

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_cursor.cxx
# Opt level: O2

void __thiscall Fl_Window::cursor(Fl_Window *this,Fl_Cursor c)

{
  Fl_Window *pFVar1;
  int iVar2;
  Fl_Window *this_00;
  Fl_Window *this_01;
  int hotx;
  char **D;
  bool bVar3;
  Fl_RGB_Image FStack_98;
  Fl_Pixmap local_58;
  
  pFVar1 = this;
  while( true ) {
    do {
      do {
        this_01 = pFVar1;
        this_00 = this;
        this = Fl_Widget::window((Fl_Widget *)this_00);
        pFVar1 = this_01;
      } while (this != (Fl_Window *)0x0);
      this = this_00;
      pFVar1 = this_00;
    } while (this_00 != this_01);
    if (c == FL_CURSOR_DEFAULT) {
      c = this_01->cursor_default;
    }
    if (this_01->i == (Fl_X *)0x0) {
      return;
    }
    iVar2 = Fl_X::set_cursor(this_01->i,c);
    if (iVar2 != 0) {
      return;
    }
    if (c == FL_CURSOR_ARROW) {
      return;
    }
    if (c == FL_CURSOR_NONE) {
      hotx = 0;
      D = fl_cursor_none_xpm;
      iVar2 = 0;
      goto LAB_00195e6e;
    }
    if (c == FL_CURSOR_WAIT) {
      iVar2 = 9;
      hotx = 7;
      D = fl_cursor_wait_xpm;
      goto LAB_00195e6e;
    }
    if (c == FL_CURSOR_NWSE) break;
    if (c == FL_CURSOR_NESW) {
      D = fl_cursor_nesw_xpm;
      goto LAB_00195e6b;
    }
    bVar3 = c == FL_CURSOR_HELP;
    c = FL_CURSOR_ARROW;
    this = this_01;
    pFVar1 = this_01;
    if (bVar3) {
      iVar2 = 3;
      D = fl_cursor_help_xpm;
      hotx = 1;
LAB_00195e6e:
      Fl_Pixmap::Fl_Pixmap(&local_58,D);
      Fl_RGB_Image::Fl_RGB_Image(&FStack_98,&local_58,0x31);
      cursor(this_01,&FStack_98,hotx,iVar2);
      Fl_RGB_Image::~Fl_RGB_Image(&FStack_98);
      Fl_Pixmap::~Fl_Pixmap(&local_58);
      return;
    }
  }
  D = fl_cursor_nwse_xpm;
LAB_00195e6b:
  iVar2 = 7;
  hotx = iVar2;
  goto LAB_00195e6e;
}

Assistant:

void Fl_Window::cursor(Fl_Cursor c) {
  int ret;

  // the cursor must be set for the top level window, not for subwindows
  Fl_Window *w = window(), *toplevel = this;

  while (w) {
    toplevel = w;
    w = w->window();
  }

  if (toplevel != this) {
    toplevel->cursor(c);
    return;
  }

  if (c == FL_CURSOR_DEFAULT)
    c = cursor_default;

  if (!i)
    return;

  ret = i->set_cursor(c);
  if (ret)
    return;

  fallback_cursor(this, c);
}